

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

void __thiscall
testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::RegisterTests
          (ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest> *this)

{
  size_type sVar1;
  pointer pcVar2;
  TestMetaFactoryBase<char> *pTVar3;
  _Alloc_hider name;
  _Alloc_hider test_case_name_00;
  _Alloc_hider value_param;
  byte bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  long *plVar9;
  char *pcVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer plVar11;
  pointer ppVar12;
  Message test_name_stream;
  int local_d4;
  linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
  test_info;
  string local_b0;
  ParamGenerator<char> generator;
  string test_case_name;
  string local_50;
  long *plVar8;
  undefined4 extraout_var_00;
  
  plVar11 = (this->tests_).
            super__Vector_base<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (plVar11 !=
      (this->tests_).
      super__Vector_base<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      test_info.value_ = plVar11->value_;
      if (test_info.value_ == (TestInfo *)0x0) {
        test_info.link_.next_ = &test_info.link_;
      }
      else {
        linked_ptr_internal::join(&test_info.link_,&plVar11->link_);
      }
      ppVar12 = (this->instantiations_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        if (ppVar12 ==
            (this->instantiations_).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) break;
        (*ppVar12->second)(&generator);
        test_case_name._M_dataplus._M_p = (pointer)&test_case_name.field_2;
        test_case_name._M_string_length = 0;
        test_case_name.field_2._M_local_buf[0] = '\0';
        sVar1 = (ppVar12->first)._M_string_length;
        if (sVar1 != 0) {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          pcVar2 = (ppVar12->first)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>((string *)&local_b0,pcVar2,pcVar2 + sVar1);
          std::__cxx11::string::append((char *)&local_b0);
          std::__cxx11::string::operator=((string *)&test_case_name,(string *)&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::_M_append
                  ((char *)&test_case_name,
                   (ulong)((test_info.value_)->test_case_base_name)._M_dataplus._M_p);
        iVar6 = (*(generator.impl_.value_)->_vptr_ParamGeneratorInterface[2])();
        plVar8 = (long *)CONCAT44(extraout_var,iVar6);
        local_d4 = 0;
        while( true ) {
          iVar6 = (*(generator.impl_.value_)->_vptr_ParamGeneratorInterface[3])();
          plVar9 = (long *)CONCAT44(extraout_var_00,iVar6);
          if (plVar8 == plVar9) {
            bVar4 = 0;
          }
          else {
            bVar4 = (**(code **)(*plVar8 + 0x30))(plVar8,plVar9);
            bVar4 = bVar4 ^ 1;
          }
          if ((plVar9 != (long *)0x0) && (bVar5 = IsTrue(true), bVar5)) {
            (**(code **)(*plVar9 + 8))(plVar9);
          }
          if (bVar4 == 0) break;
          Message::Message(&test_name_stream);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)test_name_stream.ss_.ptr_ + 0x10),
                     ((test_info.value_)->test_base_name)._M_dataplus._M_p,
                     ((test_info.value_)->test_base_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)test_name_stream.ss_.ptr_ + 0x10),"/",1);
          std::ostream::operator<<((ostream *)((long)test_name_stream.ss_.ptr_ + 0x10),local_d4);
          test_case_name_00 = test_case_name._M_dataplus;
          Message::GetString_abi_cxx11_(&local_b0,&test_name_stream);
          name._M_p = local_b0._M_dataplus._M_p;
          pcVar10 = (char *)(**(code **)(*plVar8 + 0x28))(plVar8);
          PrintToString<char>(&local_50,pcVar10);
          value_param._M_p = local_50._M_dataplus._M_p;
          iVar6 = (*(this->super_ParameterizedTestCaseInfoBase)._vptr_ParameterizedTestCaseInfoBase
                    [3])();
          pTVar3 = ((test_info.value_)->test_meta_factory).ptr_;
          pcVar10 = (char *)(**(code **)(*plVar8 + 0x28))();
          iVar7 = (*pTVar3->_vptr_TestMetaFactoryBase[2])(pTVar3,(ulong)(uint)(int)*pcVar10);
          MakeAndRegisterTestInfo
                    (test_case_name_00._M_p,name._M_p,(char *)0x0,value_param._M_p,
                     (TypeId)CONCAT44(extraout_var_01,iVar6),Test::SetUpTestCase,
                     Test::TearDownTestCase,(TestFactoryBase *)CONCAT44(extraout_var_02,iVar7));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if (((test_name_stream.ss_.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
              (bVar5 = IsTrue(true), bVar5)) &&
             (test_name_stream.ss_.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)test_name_stream.ss_.ptr_ + 8))();
          }
          (**(code **)(*plVar8 + 0x18))(plVar8);
          local_d4 = local_d4 + 1;
        }
        if ((plVar8 != (long *)0x0) && (bVar5 = IsTrue(true), bVar5)) {
          (**(code **)(*plVar8 + 8))(plVar8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)test_case_name._M_dataplus._M_p != &test_case_name.field_2) {
          operator_delete(test_case_name._M_dataplus._M_p,
                          CONCAT71(test_case_name.field_2._M_allocated_capacity._1_7_,
                                   test_case_name.field_2._M_local_buf[0]) + 1);
        }
        linked_ptr<const_testing::internal::ParamGeneratorInterface<char>_>::~linked_ptr
                  (&generator.impl_);
        ppVar12 = ppVar12 + 1;
      }
      linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
      ::~linked_ptr(&test_info);
      plVar11 = plVar11 + 1;
    } while (plVar11 !=
             (this->tests_).
             super__Vector_base<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

virtual void RegisterTests() {
    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      linked_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin(); gen_it != instantiations_.end();
               ++gen_it) {
        const string& instantiation_name = gen_it->first;
        ParamGenerator<ParamType> generator((*gen_it->second)());

        string test_case_name;
        if ( !instantiation_name.empty() )
          test_case_name = instantiation_name + "/";
        test_case_name += test_info->test_case_base_name;

        int i = 0;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          Message test_name_stream;
          test_name_stream << test_info->test_base_name << "/" << i;
          MakeAndRegisterTestInfo(
              test_case_name.c_str(),
              test_name_stream.GetString().c_str(),
              NULL,  // No type parameter.
              PrintToString(*param_it).c_str(),
              GetTestCaseTypeId(),
              TestCase::SetUpTestCase,
              TestCase::TearDownTestCase,
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }  // for gen_it
    }  // for test_it
  }